

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmmp.cc
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *ppdVar1;
  char *__s;
  bool bVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  int iVar8;
  long lVar9;
  ifstream *input_stream;
  long lVar10;
  char *__s_00;
  long lVar11;
  long lVar12;
  undefined1 auStack_4b8 [4];
  int local_4b4;
  int num_order;
  int num_mixture;
  vector<double,_std::allocator<double>_> variance;
  Buffer buffer;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> covariance_matrices;
  double log_probability;
  ostringstream error_message_5;
  char local_3e8 [96];
  ios_base local_388 [264];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  mean_vectors;
  vector<double,_std::allocator<double>_> weights;
  vector<double,_std::allocator<double>_> input_vector;
  ifstream ifs;
  char local_228 [16];
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  num_order = 0x19;
  num_mixture = 0x10;
  bVar2 = false;
  local_4b4 = 0;
  do {
    iVar6 = ya_getopt_long(argc,argv,"l:m:k:fh",(option *)0x0,(int *)0x0);
    switch(iVar6) {
    case 0x66:
      bVar2 = true;
      iVar8 = 0;
      break;
    case 0x67:
    case 0x69:
    case 0x6a:
switchD_00103932_caseD_67:
      anon_unknown.dwarf_43f9::PrintUsage((ostream *)&std::cerr);
      goto LAB_00103c28;
    case 0x68:
      anon_unknown.dwarf_43f9::PrintUsage((ostream *)&std::cout);
      local_4b4 = 0;
      iVar8 = 1;
      break;
    case 0x6b:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
      bVar5 = sptk::ConvertStringToInteger((string *)&ifs,&num_mixture);
      bVar3 = num_mixture < 1;
      if (_ifs != local_228) {
        operator_delete(_ifs);
      }
      if (!bVar5 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&ifs,"The argument for the -k option must be a positive integer",0x39)
        ;
        _error_message_5 = local_3e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&error_message_5,"gmmp","");
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
        if (_error_message_5 != local_3e8) {
          operator_delete(_error_message_5);
        }
        goto LAB_00103c0c;
      }
LAB_00103b88:
      iVar8 = 0;
      break;
    case 0x6c:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
      bVar5 = sptk::ConvertStringToInteger((string *)&ifs,&num_order);
      bVar3 = 0 < num_order;
      if (_ifs != local_228) {
        operator_delete(_ifs);
      }
      if (bVar5 && bVar3) {
        num_order = num_order + -1;
        goto LAB_00103b88;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&ifs,"The argument for the -l option must be a positive integer",0x39);
      _error_message_5 = local_3e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&error_message_5,"gmmp","");
      sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
      if (_error_message_5 != local_3e8) {
        operator_delete(_error_message_5);
      }
      goto LAB_00103c0c;
    case 0x6d:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
      bVar3 = sptk::ConvertStringToInteger((string *)&ifs,&num_order);
      bVar5 = -1 < num_order;
      if (_ifs != local_228) {
        operator_delete(_ifs);
      }
      if (bVar3 && bVar5) goto LAB_00103b88;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&ifs,"The argument for the -m option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&ifs,"non-negative integer",0x14);
      _error_message_5 = local_3e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&error_message_5,"gmmp","");
      sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
      if (_error_message_5 != local_3e8) {
        operator_delete(_error_message_5);
      }
LAB_00103c0c:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
      std::ios_base::~ios_base(local_1c8);
LAB_00103c28:
      iVar8 = 1;
      local_4b4 = 1;
      break;
    default:
      iVar8 = 2;
      if (iVar6 != -1) goto switchD_00103932_caseD_67;
    }
  } while (iVar8 == 0);
  if (iVar8 != 2) {
    return local_4b4;
  }
  if (argc - ya_optind == 1) {
    lVar12 = (long)argc + -1;
    __s_00 = (char *)0x0;
  }
  else {
    if (argc - ya_optind != 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&ifs,"Just two input files, gmmfile and infile, are required",0x36);
      _error_message_5 = local_3e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&error_message_5,"gmmp","");
      sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
      if (_error_message_5 != local_3e8) {
        operator_delete(_error_message_5);
      }
      goto LAB_00103e64;
    }
    lVar12 = (long)argc + -2;
    __s_00 = argv[(long)argc + -1];
  }
  __s = argv[lVar12];
  bVar3 = sptk::SetBinaryMode();
  if (bVar3) {
    std::vector<double,_std::allocator<double>_>::vector
              (&weights,(long)num_mixture,(allocator_type *)&ifs);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&mean_vectors,(long)num_mixture,(allocator_type *)&ifs);
    std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
              (&covariance_matrices,(long)num_mixture,(allocator_type *)&ifs);
    std::ifstream::ifstream(&ifs);
    std::ifstream::open((char *)&ifs,(_Ios_Openmode)__s);
    if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0) {
      bVar3 = num_mixture < 1;
      if (0 < num_mixture) {
        lVar10 = 0;
        lVar12 = 0;
        lVar9 = 0;
        lVar11 = 0;
        do {
          bVar3 = sptk::ReadStream<double>
                            ((double *)
                             ((long)weights.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar9),
                             (istream *)&ifs);
          if (!bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&error_message_5,"Failed to load mixture weight",0x1d);
            buffer._vptr_Buffer =
                 (_func_int **)
                 &buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
            std::__cxx11::string::_M_construct<char_const*>((string *)&buffer,"gmmp","");
            sptk::PrintErrorMessage((string *)&buffer,&error_message_5);
            if ((pointer *)buffer._vptr_Buffer !=
                &buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
              operator_delete(buffer._vptr_Buffer);
            }
            goto LAB_001040c3;
          }
          bVar3 = sptk::ReadStream<double>
                            (false,0,0,num_order + 1,
                             (vector<double,_std::allocator<double>_> *)
                             ((long)&((mean_vectors.
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data._M_start + lVar12),(istream *)&ifs,
                             (int *)0x0);
          if (!bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&error_message_5,"Failed to load mean vector",0x1a);
            buffer._vptr_Buffer =
                 (_func_int **)
                 &buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
            std::__cxx11::string::_M_construct<char_const*>((string *)&buffer,"gmmp","");
            sptk::PrintErrorMessage((string *)&buffer,&error_message_5);
            if ((pointer *)buffer._vptr_Buffer !=
                &buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
              operator_delete(buffer._vptr_Buffer);
            }
            goto LAB_001040c3;
          }
          sptk::SymmetricMatrix::Resize
                    ((SymmetricMatrix *)
                     ((long)&(covariance_matrices.
                              super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                     lVar10),num_order + 1);
          if (bVar2) {
            bVar3 = sptk::ReadStream((SymmetricMatrix *)
                                     ((long)&(covariance_matrices.
                                              super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                             _vptr_SymmetricMatrix + lVar10),(istream *)&ifs);
            if (!bVar3) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&error_message_5,"Failed to load covariance matrix",0x20);
              buffer._vptr_Buffer =
                   (_func_int **)
                   &buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish;
              std::__cxx11::string::_M_construct<char_const*>((string *)&buffer,"gmmp","");
              sptk::PrintErrorMessage((string *)&buffer,&error_message_5);
              if ((pointer *)buffer._vptr_Buffer !=
                  &buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
                operator_delete(buffer._vptr_Buffer);
              }
              goto LAB_001040c3;
            }
          }
          else {
            variance.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            variance.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            variance.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            bVar3 = sptk::ReadStream<double>
                              (false,0,0,num_order + 1,&variance,(istream *)&ifs,(int *)0x0);
            if (bVar3) {
              sptk::SymmetricMatrix::SetDiagonal
                        ((SymmetricMatrix *)
                         ((long)&(covariance_matrices.
                                  super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix
                         + lVar10),&variance);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&error_message_5,"Failed to load diagonal covariance vector",
                         0x29);
              buffer._vptr_Buffer =
                   (_func_int **)
                   &buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish;
              std::__cxx11::string::_M_construct<char_const*>((string *)&buffer,"gmmp","");
              sptk::PrintErrorMessage((string *)&buffer,&error_message_5);
              if ((pointer *)buffer._vptr_Buffer !=
                  &buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
                operator_delete(buffer._vptr_Buffer);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
              std::ios_base::~ios_base(local_388);
              local_4b4 = 1;
            }
            if (variance.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(variance.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            if (!bVar3) goto LAB_001040ec;
          }
          lVar11 = lVar11 + 1;
          lVar9 = lVar9 + 8;
          lVar12 = lVar12 + 0x18;
          lVar10 = lVar10 + 0x40;
          bVar3 = num_mixture <= lVar11;
        } while (lVar11 < num_mixture);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&error_message_5,"Cannot open file ",0x11);
      if (__s == (char *)0x0) {
        std::ios::clear((int)auStack_4b8 + (int)*(undefined8 *)(_error_message_5 + -0x18) + 0xc0);
      }
      else {
        sVar7 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&error_message_5,__s,sVar7);
      }
      ppdVar1 = &buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      buffer._vptr_Buffer = (_func_int **)ppdVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&buffer,"gmmp","");
      sptk::PrintErrorMessage((string *)&buffer,&error_message_5);
      if ((pointer *)buffer._vptr_Buffer != ppdVar1) {
        operator_delete(buffer._vptr_Buffer);
      }
LAB_001040c3:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
      std::ios_base::~ios_base(local_388);
      local_4b4 = 1;
LAB_001040ec:
      bVar3 = false;
    }
    std::ifstream::~ifstream(&ifs);
    if (bVar3) {
      input_stream = &ifs;
      std::ifstream::ifstream(input_stream);
      if ((__s_00 == (char *)0x0) ||
         (std::ifstream::open((char *)&ifs,(_Ios_Openmode)__s_00),
         (abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0)) {
        cVar4 = std::__basic_file<char>::is_open();
        if (cVar4 == '\0') {
          input_stream = (ifstream *)&std::cin;
        }
        lVar12 = (long)num_order;
        std::vector<double,_std::allocator<double>_>::vector
                  (&input_vector,lVar12 + 1U,(allocator_type *)&error_message_5);
        buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_00117b50;
        buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        buffer.precisions_.
        super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        buffer.precisions_.
        super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        buffer.precisions_.
        super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
        super__Vector_impl_data._M_finish._1_7_ = 0;
        buffer.precisions_.
        super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        buffer._73_8_ = 0;
        do {
          bVar3 = sptk::ReadStream<double>
                            (false,0,0,(int)(lVar12 + 1U),&input_vector,(istream *)input_stream,
                             (int *)0x0);
          if (!bVar3) {
            local_4b4 = 0;
            break;
          }
          bVar3 = sptk::GaussianMixtureModeling::CalculateLogProbability
                            (num_order,num_mixture,(bool)(bVar2 ^ 1),true,&input_vector,&weights,
                             &mean_vectors,&covariance_matrices,
                             (vector<double,_std::allocator<double>_> *)0x0,&log_probability,&buffer
                            );
          if (bVar3) {
            bVar5 = sptk::WriteStream<double>(log_probability,(ostream *)&std::cout);
            bVar3 = true;
            if (!bVar5) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&error_message_5,"Failed to write log-probability",0x1f);
              variance.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&variance.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct<char_const*>((string *)&variance,"gmmp","");
              sptk::PrintErrorMessage((string *)&variance,&error_message_5);
              if ((pointer *)
                  variance.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &variance.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
                operator_delete(variance.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
              }
              goto LAB_001043dc;
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&error_message_5,"Failed to compute log-probability",0x21);
            variance.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)&variance.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::_M_construct<char_const*>((string *)&variance,"gmmp","");
            sptk::PrintErrorMessage((string *)&variance,&error_message_5);
            if ((pointer *)
                variance.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start !=
                &variance.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage) {
              operator_delete(variance.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
LAB_001043dc:
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
            std::ios_base::~ios_base(local_388);
            local_4b4 = 1;
            bVar3 = false;
          }
        } while (bVar3);
        sptk::GaussianMixtureModeling::Buffer::~Buffer(&buffer);
        if (input_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(input_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&error_message_5,"Cannot open file ",0x11);
        sVar7 = strlen(__s_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&error_message_5,__s_00,sVar7)
        ;
        ppdVar1 = &buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        buffer._vptr_Buffer = (_func_int **)ppdVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&buffer,"gmmp","");
        sptk::PrintErrorMessage((string *)&buffer,&error_message_5);
        if ((pointer *)buffer._vptr_Buffer != ppdVar1) {
          operator_delete(buffer._vptr_Buffer);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
        std::ios_base::~ios_base(local_388);
        local_4b4 = 1;
      }
      std::ifstream::~ifstream(&ifs);
    }
    std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector
              (&covariance_matrices);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&mean_vectors);
    if (weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) {
      return local_4b4;
    }
    operator_delete(weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
    return local_4b4;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&ifs,"Cannot set translation mode",0x1b);
  _error_message_5 = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&error_message_5,"gmmp","");
  sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
  if (_error_message_5 != local_3e8) {
    operator_delete(_error_message_5);
  }
LAB_00103e64:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
  std::ios_base::~ios_base(local_1c8);
  return 1;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  int num_mixture(kDefaultNumMixture);
  bool full_covariance_flag(kDefaultFullCovarianceFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:k:fh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("gmmp", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("gmmp", error_message);
          return 1;
        }
        break;
      }
      case 'k': {
        if (!sptk::ConvertStringToInteger(optarg, &num_mixture) ||
            num_mixture <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -k option must be a positive integer";
          sptk::PrintErrorMessage("gmmp", error_message);
          return 1;
        }
        break;
      }
      case 'f': {
        full_covariance_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  // Get input file names.
  const char* gmm_file;
  const char* input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    gmm_file = argv[argc - 2];
    input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    gmm_file = argv[argc - 1];
    input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, gmmfile and infile, are required";
    sptk::PrintErrorMessage("gmmp", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("gmmp", error_message);
    return 1;
  }

  const bool is_diagonal(!full_covariance_flag);
  std::vector<double> weights(num_mixture);
  std::vector<std::vector<double> > mean_vectors(num_mixture);
  std::vector<sptk::SymmetricMatrix> covariance_matrices(num_mixture);
  {
    std::ifstream ifs;
    ifs.open(gmm_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << gmm_file;
      sptk::PrintErrorMessage("gmmp", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    for (int k(0); k < num_mixture; ++k) {
      if (!sptk::ReadStream(&(weights[k]), &input_stream)) {
        std::ostringstream error_message;
        error_message << "Failed to load mixture weight";
        sptk::PrintErrorMessage("gmmp", error_message);
        return 1;
      }

      if (!sptk::ReadStream(false, 0, 0, num_order + 1, &mean_vectors[k],
                            &input_stream, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to load mean vector";
        sptk::PrintErrorMessage("gmmp", error_message);
        return 1;
      }

      covariance_matrices[k].Resize(num_order + 1);
      if (is_diagonal) {
        std::vector<double> variance;
        if (!sptk::ReadStream(false, 0, 0, num_order + 1, &variance,
                              &input_stream, NULL)) {
          std::ostringstream error_message;
          error_message << "Failed to load diagonal covariance vector";
          sptk::PrintErrorMessage("gmmp", error_message);
          return 1;
        }
        covariance_matrices[k].SetDiagonal(variance);
      } else {
        if (!sptk::ReadStream(&covariance_matrices[k], &input_stream)) {
          std::ostringstream error_message;
          error_message << "Failed to load covariance matrix";
          sptk::PrintErrorMessage("gmmp", error_message);
          return 1;
        }
      }
    }
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("gmmp", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  const int length(num_order + 1);
  std::vector<double> input_vector(length);
  sptk::GaussianMixtureModeling::Buffer buffer;

  while (sptk::ReadStream(false, 0, 0, length, &input_vector, &input_stream,
                          NULL)) {
    double log_probability;
    if (!sptk::GaussianMixtureModeling::CalculateLogProbability(
            num_order, num_mixture, is_diagonal, true, input_vector, weights,
            mean_vectors, covariance_matrices, NULL, &log_probability,
            &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to compute log-probability";
      sptk::PrintErrorMessage("gmmp", error_message);
      return 1;
    }
    if (!sptk::WriteStream(log_probability, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write log-probability";
      sptk::PrintErrorMessage("gmmp", error_message);
      return 1;
    }
  }

  return 0;
}